

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O0

void slang::ast::GenerateBlockSymbol::fromSyntax
               (Compilation *compilation,IfGenerateSyntax *syntax,ASTContext *context,
               uint32_t constructIndex,bool isUninstantiated,
               SmallVectorBase<slang::ast::GenerateBlockSymbol_*> *results)

{
  undefined1 uVar1;
  bool bVar2;
  int iVar3;
  ExpressionSyntax *pEVar4;
  undefined4 extraout_var;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_RDX;
  long in_RSI;
  byte in_R8B;
  ConstantValue cv;
  Expression *cond;
  optional<bool> selector;
  Expression *in_stack_00000298;
  ASTContext *in_stack_000002a0;
  bitmask<slang::ast::EvalFlags> in_stack_000002af;
  bool *in_stack_fffffffffffffef8;
  ConstantValue *in_stack_ffffffffffffff00;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar5;
  SyntaxNode *syntax_00;
  undefined1 in_stack_ffffffffffffff81;
  undefined2 in_stack_ffffffffffffff82;
  undefined4 in_stack_ffffffffffffff84;
  ASTContext *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  bitmask<slang::ast::EvalFlags> bVar6;
  SyntaxNode local_68;
  bitmask<slang::ast::ASTFlags> local_40;
  ASTContext *local_38;
  byte local_1d;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *local_18;
  long local_10;
  ASTContext *context_00;
  
  local_1d = in_R8B & 1;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::optional<bool>::optional((optional<bool> *)0x3e9337);
  pEVar4 = not_null<slang::syntax::ExpressionSyntax_*>::operator*
                     ((not_null<slang::syntax::ExpressionSyntax_*> *)0x3e9348);
  attributes = local_18;
  bitmask<slang::ast::ASTFlags>::bitmask(&local_40,None);
  iVar3 = Expression::bind((int)pEVar4,(sockaddr *)attributes,(socklen_t)local_40.m_bits);
  context_00 = (ASTContext *)CONCAT44(extraout_var,iVar3);
  bVar6.m_bits = '\0';
  local_38 = context_00;
  bitmask<slang::ast::EvalFlags>::bitmask
            ((bitmask<slang::ast::EvalFlags> *)&stack0xffffffffffffff97);
  syntax_00 = &local_68;
  ASTContext::eval(in_stack_000002a0,in_stack_00000298,in_stack_000002af);
  uVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x3e93ed);
  pSVar5 = local_18;
  if ((((bool)uVar1) &&
      (bVar2 = ASTContext::requireBooleanConvertible
                         (in_stack_ffffffffffffff88,
                          (Expression *)
                          CONCAT44(in_stack_ffffffffffffff84,
                                   CONCAT22(in_stack_ffffffffffffff82,
                                            CONCAT11(in_stack_ffffffffffffff81,uVar1)))),
      pSVar5 = local_18, bVar2)) && ((local_1d & 1) == 0)) {
    in_stack_ffffffffffffff81 = slang::ConstantValue::isTrue(in_stack_ffffffffffffff00);
    std::optional<bool>::optional<bool,_true>
              ((optional<bool> *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    pSVar5 = local_18;
  }
  not_null<slang::syntax::MemberSyntax_*>::operator*
            ((not_null<slang::syntax::MemberSyntax_*> *)0x3e94c3);
  bVar2 = std::optional<bool>::has_value((optional<bool> *)0x3e94ef);
  if (bVar2) {
    std::optional<bool>::value((optional<bool> *)in_stack_ffffffffffffff00);
  }
  createCondGenBlock((Compilation *)
                     CONCAT44(in_stack_ffffffffffffff84,
                              CONCAT22(in_stack_ffffffffffffff82,
                                       CONCAT11(in_stack_ffffffffffffff81,uVar1))),syntax_00,
                     context_00,(uint32_t)((ulong)pSVar5 >> 0x20),SUB81((ulong)pSVar5 >> 0x18,0),
                     attributes,
                     (SmallVectorBase<slang::ast::GenerateBlockSymbol_*> *)
                     CONCAT17(bVar6.m_bits,in_stack_ffffffffffffff90));
  if (*(long *)(local_10 + 0x90) != 0) {
    not_null<slang::syntax::SyntaxNode_*>::operator*
              ((not_null<slang::syntax::SyntaxNode_*> *)0x3e959a);
    bVar2 = std::optional<bool>::has_value((optional<bool> *)0x3e95c6);
    if (bVar2) {
      std::optional<bool>::value((optional<bool> *)in_stack_ffffffffffffff00);
    }
    createCondGenBlock((Compilation *)
                       CONCAT44(in_stack_ffffffffffffff84,
                                CONCAT22(in_stack_ffffffffffffff82,
                                         CONCAT11(in_stack_ffffffffffffff81,uVar1))),syntax_00,
                       context_00,(uint32_t)((ulong)pSVar5 >> 0x20),SUB81((ulong)pSVar5 >> 0x18,0),
                       attributes,
                       (SmallVectorBase<slang::ast::GenerateBlockSymbol_*> *)
                       CONCAT17(bVar6.m_bits,in_stack_ffffffffffffff90));
  }
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x3e9643);
  return;
}

Assistant:

void GenerateBlockSymbol::fromSyntax(Compilation& compilation, const IfGenerateSyntax& syntax,
                                     const ASTContext& context, uint32_t constructIndex,
                                     bool isUninstantiated,
                                     SmallVectorBase<GenerateBlockSymbol*>& results) {
    std::optional<bool> selector;
    auto& cond = Expression::bind(*syntax.condition, context);
    ConstantValue cv = context.eval(cond);
    if (cv && context.requireBooleanConvertible(cond) && !isUninstantiated)
        selector = cv.isTrue();

    createCondGenBlock(compilation, *syntax.block, context, constructIndex,
                       !selector.has_value() || !selector.value(), syntax.attributes, results);
    if (syntax.elseClause) {
        createCondGenBlock(compilation, *syntax.elseClause->clause, context, constructIndex,
                           !selector.has_value() || selector.value(), syntax.attributes, results);
    }
}